

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

bool __thiscall
pybind11::detail::argument_loader<pybind11::detail::value_and_holder&>::load_impl_sequence<0ul>
          (argument_loader<pybind11::detail::value_and_holder&> *this,long call)

{
  undefined8 uVar1;
  
  uVar1 = **(undefined8 **)(call + 8);
  std::vector<bool,_std::allocator<bool>_>::operator[]
            ((vector<bool,_std::allocator<bool>_> *)(call + 0x20),0);
  *(undefined8 *)this = uVar1;
  return true;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
#ifdef __cpp_fold_expressions
        if ((... || !std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])))
            return false;
#else
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
#endif
        return true;
    }